

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_DynamicLib.cpp
# Opt level: O0

int __thiscall axl::sys::psx::DynamicLib::open(DynamicLib *this,char *__file,int __oflag,...)

{
  C *pCVar1;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *extraout_RAX;
  bool bVar2;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  sl::Handle<void_*,_axl::sys::psx::CloseDynamicLib,_axl::sl::Zero<void_*>_>::close
            (&this->super_Handle<void_*,_axl::sys::psx::CloseDynamicLib,_axl::sl::Zero<void_*>_>,
             (int)__file);
  pCVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                     ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)this);
  pCVar1 = (C *)dlopen(pCVar1,__oflag);
  ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)this)->m_p = pCVar1;
  bVar2 = ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)this)->m_p != (C *)0x0;
  if (!bVar2) {
    dlerror();
    err::ErrorRef::ErrorRef
              ((ErrorRef *)CONCAT44(__oflag,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    err::setError((ErrorRef *)0x143c37);
    err::ErrorRef::~ErrorRef((ErrorRef *)0x143c43);
    this = (DynamicLib *)extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),bVar2);
}

Assistant:

bool
DynamicLib::open(
	const sl::StringRef& name,
	int flags
) {
	close();

	m_h = ::dlopen(name.sz(), flags);
	if (!m_h) {
		err::setError(::dlerror());
		return false;
	}

	return true;
}